

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O0

dict_insert_result wb_tree_insert(wb_tree *tree,void *key)

{
  wb_node *pwVar1;
  uint uVar2;
  wb_node *pwVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  undefined8 extraout_RDX_01;
  dict_insert_result dVar5;
  uint local_4c;
  uint rotations;
  wb_node *add;
  wb_node *parent;
  wb_node *node;
  int cmp;
  void *key_local;
  wb_tree *tree_local;
  undefined1 local_10;
  
  node._4_4_ = 0;
  parent = tree->root;
  add = (wb_node *)0x0;
  do {
    pwVar3 = parent;
    if (parent == (wb_node *)0x0) {
      pwVar3 = node_new(key);
      uVar4 = extraout_RDX_00;
      if (pwVar3 == (wb_node *)0x0) {
        tree_local = (wb_tree *)0x0;
        local_10 = 0;
      }
      else {
        pwVar3->parent = add;
        if (add == (wb_node *)0x0) {
          if (tree->count != 0) {
            fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
                    ,0x100,"wb_tree_insert","tree->count == 0");
            abort();
          }
          if (tree->root != (wb_node *)0x0) {
            fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
                    ,0x101,"wb_tree_insert","tree->root == NULL");
            abort();
          }
          tree->root = pwVar3;
        }
        else {
          if (node._4_4_ < 0) {
            add->llink = pwVar3;
          }
          else {
            add->rlink = pwVar3;
          }
          local_4c = 0;
          while (add != (wb_node *)0x0) {
            pwVar1 = add->parent;
            add->weight = add->weight + 1;
            uVar2 = fixup(tree,add);
            local_4c = uVar2 + local_4c;
            uVar4 = extraout_RDX_01;
            add = pwVar1;
          }
          tree->rotation_count = (ulong)local_4c + tree->rotation_count;
        }
        tree->count = tree->count + 1;
        tree_local = (wb_tree *)&pwVar3->datum;
        local_10 = 1;
      }
LAB_001093b1:
      dVar5._9_7_ = (undefined7)((ulong)uVar4 >> 8);
      dVar5.inserted = (_Bool)local_10;
      dVar5.datum_ptr = &tree_local->root;
      return dVar5;
    }
    node._4_4_ = (*tree->cmp_func)(key,parent->key);
    if (node._4_4_ < 0) {
      parent = parent->llink;
    }
    else {
      if (node._4_4_ == 0) {
        tree_local = (wb_tree *)&parent->datum;
        local_10 = 0;
        uVar4 = extraout_RDX;
        goto LAB_001093b1;
      }
      parent = parent->rlink;
    }
    add = pwVar3;
  } while( true );
}

Assistant:

dict_insert_result
wb_tree_insert(wb_tree* tree, void* key)
{
    int cmp = 0;

    wb_node* node = tree->root;
    wb_node* parent = NULL;
    while (node) {
	cmp = tree->cmp_func(key, node->key);
	if (cmp < 0) {
	    parent = node; node = node->llink;
	} else if (cmp) {
	    parent = node; node = node->rlink;
	} else
	    return (dict_insert_result) { &node->datum, false };
    }

    wb_node* const add = node = node_new(key);
    if (!add)
	return (dict_insert_result) { NULL, false };

    if (!(node->parent = parent)) {
	ASSERT(tree->count == 0);
	ASSERT(tree->root == NULL);
	tree->root = node;
    } else {
	if (cmp < 0)
	    parent->llink = node;
	else
	    parent->rlink = node;

	unsigned rotations = 0;
	while ((node = parent) != NULL) {
	    parent = node->parent;
	    ++node->weight;
	    rotations += fixup(tree, node);
	}
	tree->rotation_count += rotations;
    }
    tree->count++;
    return (dict_insert_result) { &add->datum, true };
}